

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O0

void Fxu_CreateCovers(Fxu_Matrix *p,Fxu_Data_t *pData)

{
  int iVar1;
  Fxu_Cube *pFVar2;
  int local_40;
  int n;
  int iNode;
  char *pSopCover;
  Fxu_Cube *pCubeNext;
  Fxu_Cube *pCubeFirst;
  Fxu_Cube *pCube;
  Fxu_Data_t *pData_local;
  Fxu_Matrix *p_local;
  
  pCubeNext = Fxu_CreateCoversFirstCube(p,pData,0);
  for (local_40 = 0; local_40 < pData->nNodesOld; local_40 = local_40 + 1) {
    pFVar2 = pCubeNext;
    if (pData->vSops->pArray[local_40] != (void *)0x0) {
      pFVar2 = Fxu_CreateCoversFirstCube(p,pData,local_40 + 1);
      pCubeFirst = pCubeNext;
      while ((pCubeFirst != pFVar2 &&
             (((pCubeFirst->lLits).pTail == (Fxu_Lit *)0x0 ||
              (iVar1 = ((pCubeFirst->lLits).pTail)->iVar,
              SBORROW4(iVar1,pData->nNodesOld * 2) != iVar1 + pData->nNodesOld * -2 < 0))))) {
        pCubeFirst = pCubeFirst->pNext;
      }
      if (pCubeFirst != pFVar2) {
        Fxu_CreateCoversNode(p,pData,local_40,pCubeNext,pFVar2);
      }
    }
    pCubeNext = pFVar2;
  }
  for (local_40 = 0; local_40 < pData->nNodesNew; local_40 = local_40 + 1) {
    iVar1 = pData->nNodesOld + local_40;
    pFVar2 = Fxu_CreateCoversFirstCube(p,pData,iVar1 + 1);
    Fxu_CreateCoversNode(p,pData,iVar1,pCubeNext,pFVar2);
    pCubeNext = pFVar2;
  }
  return;
}

Assistant:

void Fxu_CreateCovers( Fxu_Matrix * p, Fxu_Data_t * pData )
{
    Fxu_Cube * pCube, * pCubeFirst, * pCubeNext;
    char * pSopCover;
    int iNode, n;

    // get the first cube of the first internal node 
    pCubeFirst = Fxu_CreateCoversFirstCube( p, pData, 0 );

    // go through the internal nodes
    for ( n = 0; n < pData->nNodesOld; n++ )
    if ( (pSopCover = (char *)pData->vSops->pArray[n]) )
    {
        // get the number of this node
        iNode = n;
        // get the next first cube
        pCubeNext = Fxu_CreateCoversFirstCube(  p, pData, iNode + 1 );
        // check if there any new variables in these cubes
        for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
            if ( pCube->lLits.pTail && pCube->lLits.pTail->iVar >= 2 * pData->nNodesOld )
                break;
        if ( pCube != pCubeNext )
            Fxu_CreateCoversNode( p, pData, iNode, pCubeFirst, pCubeNext );
        // update the first cube
        pCubeFirst = pCubeNext;
    }

    // add the covers for the extracted nodes
    for ( n = 0; n < pData->nNodesNew; n++ )
    {
        // get the number of this node
        iNode = pData->nNodesOld + n;
        // get the next first cube
        pCubeNext = Fxu_CreateCoversFirstCube( p, pData, iNode + 1 );
        // the node should be added
        Fxu_CreateCoversNode( p, pData, iNode, pCubeFirst, pCubeNext );
        // update the first cube
        pCubeFirst = pCubeNext;
    }
}